

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void shift_reg(DisasContext_conflict2 *s,uint16_t insn,int opsize)

{
  TCGContext_conflict2 *tcg_ctx;
  int iVar1;
  uint uVar2;
  TCGv_i32 arg;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i32 ret_01;
  TCGv_i32 c2;
  TCGv_i64 c2_00;
  uintptr_t o;
  uintptr_t o_3;
  uintptr_t o_2;
  
  tcg_ctx = s->uc->tcg_ctx;
  iVar1 = opsize_bytes(opsize);
  uVar2 = insn & 7;
  arg = gen_extend(s,tcg_ctx->cpu_dregs[uVar2],opsize,(insn & 8) >> 3 ^ 1);
  ret = tcg_temp_new_i64(tcg_ctx);
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  ret_01 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_andi_i32_m68k
            (tcg_ctx,ret_01,*(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + (ulong)(insn >> 6 & 0x38)),0x3f
            );
  tcg_gen_extu_i32_i64_m68k(tcg_ctx,ret_00,ret_01);
  tcg_gen_extu_i32_i64_m68k(tcg_ctx,ret,arg);
  tcg_gen_movi_i32(tcg_ctx,QREG_CC_V,0);
  if ((insn >> 8 & 1) == 0) {
    tcg_gen_shli_i64_m68k(tcg_ctx,ret,ret,0x20);
    tcg_gen_op3_m68k(tcg_ctx,((insn & 8) == 0) + INDEX_op_shr_i64,
                     (TCGArg)(ret + (long)&tcg_ctx->pool_cur),
                     (TCGArg)(ret + (long)&tcg_ctx->pool_cur),
                     (TCGArg)(ret_00 + (long)&tcg_ctx->pool_cur));
    tcg_gen_extr_i64_i32_m68k(tcg_ctx,QREG_CC_C,QREG_CC_N,ret);
    tcg_gen_shri_i32_m68k(tcg_ctx,QREG_CC_C,QREG_CC_C,0x1f);
    tcg_gen_movcond_i32_m68k(tcg_ctx,TCG_COND_NE,QREG_CC_X,ret_01,QREG_CC_V,QREG_CC_C,QREG_CC_X);
  }
  else {
    tcg_gen_shl_i64_m68k(tcg_ctx,ret,ret,ret_00);
    if (opsize == 2) {
      tcg_gen_extr_i64_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_C,ret);
    }
    else {
      c2 = tcg_const_i32_m68k(tcg_ctx,0);
      tcg_gen_extrl_i64_i32_m68k(tcg_ctx,QREG_CC_N,ret);
      tcg_gen_shri_i32_m68k(tcg_ctx,QREG_CC_C,QREG_CC_N,iVar1 << 3);
      tcg_gen_movcond_i32_m68k(tcg_ctx,TCG_COND_EQ,QREG_CC_C,ret_01,c2,c2,QREG_CC_C);
      tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
    }
    tcg_gen_andi_i32_m68k(tcg_ctx,QREG_CC_C,QREG_CC_C,1);
    tcg_gen_movcond_i32_m68k(tcg_ctx,TCG_COND_NE,QREG_CC_X,ret_01,QREG_CC_V,QREG_CC_C,QREG_CC_X);
    if (((insn & 8) == 0) && ((s->env->features & 1) != 0)) {
      c2_00 = tcg_const_i64_m68k(tcg_ctx,0x20);
      tcg_gen_movcond_i64_m68k(tcg_ctx,TCG_COND_GT,ret_00,ret_00,c2_00,c2_00,ret_00);
      tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(c2_00 + (long)tcg_ctx));
      tcg_gen_ext_i32_i64_m68k(tcg_ctx,ret,arg);
      tcg_gen_shl_i64_m68k(tcg_ctx,ret_00,ret,ret_00);
      tcg_gen_op3_m68k(tcg_ctx,INDEX_op_xor_i64,(TCGArg)(ret + (long)&tcg_ctx->pool_cur),
                       (TCGArg)(ret + (long)&tcg_ctx->pool_cur),
                       (TCGArg)(ret_00 + (long)&tcg_ctx->pool_cur));
      tcg_gen_andi_i64_m68k(tcg_ctx,ret,ret,-1L << ((char)(iVar1 << 3) - 1U & 0x3f));
      tcg_gen_setcondi_i64_m68k(tcg_ctx,TCG_COND_NE,ret,ret,0);
      tcg_gen_extrl_i64_i32_m68k(tcg_ctx,QREG_CC_V,ret);
      tcg_gen_neg_i32(tcg_ctx,QREG_CC_V,QREG_CC_V);
    }
  }
  gen_ext(tcg_ctx,QREG_CC_N,QREG_CC_N,opsize,1);
  tcg_gen_mov_i32(tcg_ctx,QREG_CC_Z,QREG_CC_N);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  gen_partset_reg(tcg_ctx,opsize,tcg_ctx->cpu_dregs[uVar2],QREG_CC_N);
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

static void shift_reg(TCGContext *tcg_ctx, TCGv_i64 dst, TCGv_i64 src, int sf,
                      enum a64_shift_type shift_type, TCGv_i64 shift_amount)
{
    switch (shift_type) {
    case A64_SHIFT_TYPE_LSL:
        tcg_gen_shl_i64(tcg_ctx, dst, src, shift_amount);
        break;
    case A64_SHIFT_TYPE_LSR:
        tcg_gen_shr_i64(tcg_ctx, dst, src, shift_amount);
        break;
    case A64_SHIFT_TYPE_ASR:
        if (!sf) {
            tcg_gen_ext32s_i64(tcg_ctx, dst, src);
        }
        tcg_gen_sar_i64(tcg_ctx, dst, sf ? src : dst, shift_amount);
        break;
    case A64_SHIFT_TYPE_ROR:
        if (sf) {
            tcg_gen_rotr_i64(tcg_ctx, dst, src, shift_amount);
        } else {
            TCGv_i32 t0, t1;
            t0 = tcg_temp_new_i32(tcg_ctx);
            t1 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_extrl_i64_i32(tcg_ctx, t0, src);
            tcg_gen_extrl_i64_i32(tcg_ctx, t1, shift_amount);
            tcg_gen_rotr_i32(tcg_ctx, t0, t0, t1);
            tcg_gen_extu_i32_i64(tcg_ctx, dst, t0);
            tcg_temp_free_i32(tcg_ctx, t0);
            tcg_temp_free_i32(tcg_ctx, t1);
        }
        break;
    default:
        assert(FALSE); /* all shift types should be handled */
        break;
    }

    if (!sf) { /* zero extend final result */
        tcg_gen_ext32u_i64(tcg_ctx, dst, dst);
    }
}